

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_sequence(fy_emitter *emit,fy_node *fyn,int flags,int indent)

{
  _Bool _Var1;
  fy_node *pfVar2;
  fy_token *fyt_value_00;
  fy_emit_save_ctx *sc;
  fy_emit_save_ctx sct;
  _Bool last;
  fy_token *fyt_value;
  fy_node *fynin;
  fy_node *fyni;
  int indent_local;
  int flags_local;
  fy_node *fyn_local;
  fy_emitter *emit_local;
  
  memset((fy_emit_save_ctx *)&sc,0,0x28);
  sct._0_4_ = flags;
  sct.old_indent = indent;
  _Var1 = fy_node_list_empty(&(fyn->field_12).sequence);
  sc._0_1_ = (byte)sc & 0xf8 | _Var1 << 2 | fyn->style == FYNS_FLOW | ((flags & 0x10U) != 0) << 1;
  sc._4_4_ = sct.old_indent;
  fy_emit_sequence_prolog(emit,(fy_emit_save_ctx *)&sc);
  fynin = fy_node_list_head(&(fyn->field_12).sequence);
  while (fynin != (fy_node *)0x0) {
    pfVar2 = fy_node_next(&(fyn->field_12).sequence,fynin);
    sct.s_indent._3_1_ = (pfVar2 != (fy_node *)0x0 ^ 0xffU) & 1;
    fyt_value_00 = fy_node_value_token(fynin);
    fy_emit_sequence_item_prolog(emit,(fy_emit_save_ctx *)&sc,fyt_value_00);
    fy_emit_node_internal(emit,fynin,sct._0_4_,sct.old_indent,false);
    fy_emit_sequence_item_epilog
              (emit,(fy_emit_save_ctx *)&sc,(_Bool)(sct.s_indent._3_1_ & 1),fyt_value_00);
    fynin = pfVar2;
  }
  fy_emit_sequence_epilog(emit,(fy_emit_save_ctx *)&sc);
  return;
}

Assistant:

void fy_emit_sequence(struct fy_emitter *emit, struct fy_node *fyn, int flags, int indent) {
    struct fy_node *fyni, *fynin;
    struct fy_token *fyt_value;
    bool last;
    struct fy_emit_save_ctx sct, *sc = &sct;

    memset(sc, 0, sizeof(*sc));

    sc->flags = flags;
    sc->indent = indent;
    sc->empty = fy_node_list_empty(&fyn->sequence);
    sc->flow_token = fyn->style == FYNS_FLOW;
    sc->flow = !!(flags & DDNF_FLOW);
    sc->old_indent = sc->indent;

    fy_emit_sequence_prolog(emit, sc);

    for (fyni = fy_node_list_head(&fyn->sequence); fyni; fyni = fynin) {

        fynin = fy_node_next(&fyn->sequence, fyni);
        last = !fynin;
        fyt_value = fy_node_value_token(fyni);

        fy_emit_sequence_item_prolog(emit, sc, fyt_value);
        fy_emit_node_internal(emit, fyni, sc->flags, sc->indent, false);
        fy_emit_sequence_item_epilog(emit, sc, last, fyt_value);
    }

    fy_emit_sequence_epilog(emit, sc);
}